

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::TransformNode::TransformNode
          (TransformNode *this,AffineSpace3fa *xfm,Ref<embree::SceneGraph::Node> *child)

{
  long lVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  unsigned_long *puVar5;
  void *pvVar6;
  long *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  Node *in_stack_fffffffffffff9a0;
  size_t in_stack_fffffffffffff9a8;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [24];
  long *local_560;
  undefined8 *local_558;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  long *local_528;
  long *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined1 *local_500;
  undefined1 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined1 *local_4c0;
  undefined8 *local_4b8;
  undefined1 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 *local_480;
  undefined1 *local_460;
  undefined1 *local_440;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined8 *local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined4 *local_350;
  undefined4 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined1 *local_228;
  undefined8 *local_220;
  undefined1 *local_218;
  undefined8 *local_210;
  undefined1 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  ulong local_180;
  ulong local_178;
  long local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  undefined8 *local_148;
  long local_140;
  long local_138;
  ulong local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  long local_98;
  long local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 *local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  undefined8 *local_10;
  ulong local_8;
  
  local_560 = in_RDX;
  local_558 = in_RSI;
  Node::Node(in_stack_fffffffffffff9a0,(bool)in_stack_fffffffffffff99f);
  *in_RDI = &PTR__TransformNode_006200c0;
  local_3d8 = in_RDI + 0xd;
  local_540 = &local_5e8;
  local_548 = local_558;
  local_538 = local_558;
  local_1b8 = local_558;
  local_498 = *local_558;
  uStack_490 = local_558[1];
  local_1c0 = &local_5d8;
  local_1c8 = local_558 + 2;
  local_5d8 = *local_1c8;
  uStack_5d0 = local_558[3];
  local_1d0 = &local_5c8;
  local_1d8 = local_558 + 4;
  local_5c8 = *local_1d8;
  uStack_5c0 = local_558[5];
  local_1e0 = &local_5b8;
  local_1e8 = local_558 + 6;
  local_5b8 = *local_1e8;
  uStack_5b0 = local_558[7];
  local_510 = &local_5a8;
  local_518 = &local_5e8;
  local_4b0 = local_598;
  local_4b8 = &local_5d8;
  local_4c0 = local_588;
  local_4c8 = &local_5c8;
  local_500 = local_578;
  local_508 = &local_5b8;
  local_3e0 = &local_5a8;
  local_3e4 = 0;
  local_3e8 = 0x3f800000;
  local_348 = &local_3e4;
  local_350 = &local_3e8;
  *(undefined4 *)local_3d8 = 0;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0x3f800000;
  local_3d0 = in_RDI + 0xe;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  *(undefined1 *)(in_RDI + 0x12) = 0;
  puVar4 = in_RDI + 0xe;
  local_3c0 = &local_428;
  local_200 = &local_418;
  local_208 = local_598;
  local_210 = &local_408;
  local_218 = local_588;
  local_220 = &local_3f8;
  local_228 = local_578;
  local_368 = &local_428;
  local_310 = &local_3a8;
  local_2c8 = &local_398;
  local_2d0 = &local_388;
  local_2b8 = &local_378;
  local_288 = &local_418;
  local_280 = &local_398;
  local_398 = local_418;
  uStack_390 = uStack_410;
  local_298 = &local_408;
  local_290 = &local_388;
  local_388 = local_408;
  uStack_380 = uStack_400;
  local_308 = &local_3f8;
  local_300 = &local_378;
  local_378 = local_3f8;
  uStack_370 = uStack_3f0;
  local_150 = in_RDI[0xf];
  local_18 = in_RDI[0xf] + 1;
  local_530 = local_540;
  local_4e0 = local_500;
  local_4d8 = local_518;
  local_4d0 = local_510;
  local_4a8 = local_518;
  local_4a0 = local_510;
  local_480 = local_510;
  local_460 = local_4b0;
  local_440 = local_4c0;
  local_3c8 = local_3e0;
  local_3b8 = local_3e0;
  local_3b0 = local_3c0;
  local_360 = puVar4;
  local_340 = local_3d8;
  local_318 = local_368;
  local_2f8 = local_310;
  local_2c0 = local_310;
  local_2a8 = local_368;
  local_2a0 = local_310;
  local_278 = local_368;
  local_270 = local_310;
  local_1f8 = local_3e0;
  local_1f0 = local_3c0;
  local_1b0 = local_540;
  local_10 = puVar4;
  local_5e8 = local_498;
  uStack_5e0 = uStack_490;
  local_5a8 = local_498;
  uStack_5a0 = uStack_490;
  local_428 = local_498;
  uStack_420 = uStack_490;
  local_3a8 = local_498;
  uStack_3a0 = uStack_490;
  if ((ulong)in_RDI[0x10] < local_18) {
    local_8 = local_18;
    if (in_RDI[0x10] != 0) {
      local_20 = in_RDI[0x10];
      while (local_20 < local_18) {
        local_30[1] = 1;
        local_30[0] = local_20 << 1;
        puVar5 = std::max<unsigned_long>(local_30 + 1,local_30);
        local_20 = *puVar5;
      }
      local_8 = local_20;
    }
  }
  else {
    local_8 = in_RDI[0x10];
  }
  local_158 = local_8;
  uVar3 = local_150;
  if (local_150 < (ulong)in_RDI[0xf]) {
    while (local_160 = uVar3, local_160 < (ulong)in_RDI[0xf]) {
      uVar3 = local_160 + 1;
    }
    in_RDI[0xf] = local_150;
  }
  local_148 = puVar4;
  if (local_8 == in_RDI[0x10]) {
    for (local_168 = in_RDI[0xf]; local_168 < local_150; local_168 = local_168 + 1) {
      local_140 = in_RDI[0x11] + local_168 * 0x40;
      local_e0 = local_140 + 0x10;
      local_e8 = local_140 + 0x20;
      local_90 = local_140 + 0x30;
      local_f0 = local_140;
      local_d8 = local_140;
    }
    in_RDI[0xf] = local_150;
  }
  else {
    local_170 = in_RDI[0x11];
    local_130 = local_8;
    local_128 = puVar4;
    pvVar6 = alignedMalloc(in_stack_fffffffffffff9a8,(size_t)in_stack_fffffffffffff9a0);
    in_RDI[0x11] = pvVar6;
    for (local_178 = 0; local_178 < (ulong)in_RDI[0xf]; local_178 = local_178 + 1) {
      local_118 = (undefined8 *)(in_RDI[0x11] + local_178 * 0x40);
      local_120 = (undefined8 *)(local_170 + local_178 * 0x40);
      local_b0 = local_118 + 2;
      local_b8 = local_118 + 4;
      local_a0 = local_118 + 6;
      uVar2 = local_120[1];
      *local_118 = *local_120;
      local_118[1] = uVar2;
      local_68 = local_120 + 2;
      local_60 = local_118 + 2;
      uVar2 = local_120[3];
      *local_60 = *local_68;
      local_118[3] = uVar2;
      local_78 = local_120 + 4;
      local_70 = local_118 + 4;
      uVar2 = local_120[5];
      *local_70 = *local_78;
      local_118[5] = uVar2;
      local_110 = local_120 + 6;
      local_108 = local_118 + 6;
      uVar2 = local_120[7];
      *local_108 = *local_110;
      local_118[7] = uVar2;
      local_100 = local_118;
      local_a8 = local_118;
      local_88 = local_120;
      local_80 = local_118;
      local_58 = local_120;
      local_50 = local_118;
    }
    for (local_180 = in_RDI[0xf]; local_180 < local_150; local_180 = local_180 + 1) {
      local_138 = in_RDI[0x11] + local_180 * 0x40;
      local_c8 = local_138 + 0x10;
      local_d0 = local_138 + 0x20;
      local_98 = local_138 + 0x30;
      local_f8 = local_138;
      local_c0 = local_138;
    }
    local_48 = in_RDI[0x10];
    local_40 = local_170;
    local_38 = puVar4;
    alignedFree((void *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    in_RDI[0xf] = local_150;
    in_RDI[0x10] = local_158;
  }
  lVar1 = in_RDI[0xf];
  in_RDI[0xf] = lVar1 + 1;
  local_330 = (undefined8 *)(in_RDI[0x11] + lVar1 * 0x40);
  local_338 = &local_3a8;
  local_2e0 = local_330 + 2;
  local_2e8 = local_330 + 4;
  local_2b0 = local_330 + 6;
  *local_330 = local_3a8;
  local_330[1] = uStack_3a0;
  local_248 = &local_398;
  local_240 = local_330 + 2;
  *local_240 = local_398;
  local_330[3] = uStack_390;
  local_258 = &local_388;
  local_250 = local_330 + 4;
  *local_250 = local_388;
  local_330[5] = uStack_380;
  local_328 = &local_378;
  local_320 = local_330 + 6;
  *(undefined4 *)local_320 = (undefined4)local_378;
  *(undefined4 *)((long)local_330 + 0x34) = local_378._4_4_;
  *(undefined4 *)(local_330 + 7) = (undefined4)uStack_370;
  *(undefined4 *)((long)local_330 + 0x3c) = uStack_370._4_4_;
  local_520 = in_RDI + 0x13;
  local_528 = local_560;
  *local_520 = *local_560;
  if (*local_520 != 0) {
    local_2f0 = local_330;
    local_2d8 = local_330;
    local_268 = local_338;
    local_260 = local_330;
    local_238 = local_338;
    local_230 = local_330;
    (**(code **)(*(long *)*local_520 + 0x10))();
  }
  return;
}

Assistant:

TransformNode (const AffineSpace3fa& xfm, const Ref<Node>& child)
        : spaces((AffineSpace3ff)xfm), child(child) {}